

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O0

void __thiscall tcu::LogShader::~LogShader(LogShader *this)

{
  LogShader *this_local;
  
  std::__cxx11::string::~string((string *)&this->m_infoLog);
  std::__cxx11::string::~string((string *)&this->m_source);
  return;
}

Assistant:

LogShader (qpShaderType type, const std::string& source, bool compileOk, const std::string& infoLog)
		: m_type		(type)
		, m_source		(source)
		, m_compileOk	(compileOk)
		, m_infoLog		(infoLog)
	{
	}